

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O1

void __thiscall
VariationalBayesEstimatorOnLDA::updateBeta
          (VariationalBayesEstimatorOnLDA *this,BetaUpdateManner manner)

{
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_RCX;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *pol;
  integral_constant<int,_53> *in_RDX;
  integral_constant<int,_53> *extraout_RDX;
  integral_constant<int,_53> *extraout_RDX_00;
  integral_constant<int,_53> *extraout_RDX_01;
  integral_constant<int,_53> *extraout_RDX_02;
  integral_constant<int,_53> *extraout_RDX_03;
  integral_constant<int,_53> *extraout_RDX_04;
  integral_constant<int,_53> *extraout_RDX_05;
  integral_constant<int,_53> *extraout_RDX_06;
  integral_constant<int,_53> *extraout_RDX_07;
  integral_constant<int,_53> *extraout_RDX_08;
  integral_constant<int,_53> *extraout_RDX_09;
  integral_constant<int,_53> *extraout_RDX_10;
  integral_constant<int,_53> *extraout_RDX_11;
  integral_constant<int,_53> *extraout_RDX_12;
  integral_constant<int,_53> *piVar1;
  integral_constant<int,_53> *extraout_RDX_13;
  integral_constant<int,_53> *extraout_RDX_14;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST5;
  double dVar10;
  double dVar11;
  double dVar12;
  double commonBeta;
  double local_118;
  undefined2 uStack_110;
  detail local_f9;
  double local_f8;
  longdouble local_ec;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (manner == SYMMETRY) {
    if (this->_K == 0) {
      local_118 = NAN;
    }
    else {
      dVar10 = 0.0;
      lVar5 = (longdouble)1.79769313486232e+308;
      dVar12 = 0.0;
      dVar11 = 0.0;
      do {
        _local_118 = CONCAT28(uStack_110,dVar11);
        local_f8 = dVar10;
        local_d8 = dVar12;
        if (this->_V != 0) {
          uVar2 = 0;
          do {
            in_RCX = *(policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                       **)&(this->_nkv).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)dVar10].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
            local_88 = *(double *)(in_RCX + uVar2 * 8) +
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar2];
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_e0,(longdouble)local_88,in_RDX,in_RCX);
            dVar11 = 0.0;
            piVar1 = extraout_RDX_03;
            lVar6 = in_ST1;
            lVar7 = in_ST3;
            if (lVar5 < ABS(in_ST0)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              dVar11 = (double)in_ST0;
              piVar1 = extraout_RDX_04;
              lVar6 = in_ST1;
              lVar7 = in_ST3;
              local_90 = dVar11;
            }
            in_ST3 = in_ST5;
            in_ST1 = lVar7;
            local_98 = (double)in_ST0;
            if (ABS(in_ST0) <= lVar5) {
              dVar11 = local_98;
            }
            lVar9 = in_ST3;
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_e0,
                       (longdouble)
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar2],piVar1,in_RCX);
            lVar7 = ABS(lVar6);
            dVar12 = 0.0;
            in_RDX = extraout_RDX_05;
            in_ST0 = in_ST2;
            lVar8 = in_ST4;
            if (lVar5 < lVar7) {
              local_ec = lVar7;
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              dVar12 = (double)lVar6;
              in_RDX = extraout_RDX_06;
              lVar7 = local_ec;
              in_ST0 = in_ST2;
              lVar8 = in_ST4;
              local_a0 = dVar12;
            }
            in_ST4 = lVar9;
            in_ST2 = lVar8;
            local_a8 = (double)lVar6;
            if (lVar7 <= lVar5) {
              dVar12 = local_a8;
            }
            _local_118 = CONCAT28(uStack_110,
                                  local_118 +
                                  (dVar11 - dVar12) *
                                  (this->_beta).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar2]);
            uVar2 = uVar2 + 1;
            in_ST5 = in_ST4;
          } while (uVar2 < this->_V);
        }
        dVar10 = local_f8;
        local_b0 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)local_f8] + this->_betaSum;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_e0,(longdouble)local_b0,in_RDX,in_RCX);
        dVar11 = 0.0;
        piVar1 = extraout_RDX_07;
        lVar6 = in_ST1;
        lVar7 = in_ST3;
        if (lVar5 < ABS(in_ST0)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          dVar11 = (double)in_ST0;
          piVar1 = extraout_RDX_08;
          lVar6 = in_ST1;
          lVar7 = in_ST3;
          local_b8 = dVar11;
        }
        in_ST3 = in_ST5;
        in_ST1 = lVar7;
        local_c0 = (double)in_ST0;
        if (ABS(in_ST0) <= lVar5) {
          dVar11 = local_c0;
        }
        lVar9 = in_ST3;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_e0,(longdouble)this->_betaSum,piVar1,in_RCX);
        lVar7 = ABS(lVar6);
        dVar12 = 0.0;
        in_RDX = extraout_RDX_09;
        in_ST0 = in_ST2;
        lVar8 = in_ST4;
        if (lVar5 < lVar7) {
          local_ec = lVar7;
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          dVar12 = (double)lVar6;
          in_RDX = extraout_RDX_10;
          lVar7 = local_ec;
          in_ST0 = in_ST2;
          lVar8 = in_ST4;
          local_c8 = dVar12;
        }
        in_ST4 = lVar9;
        in_ST2 = lVar8;
        local_d0 = (double)lVar6;
        if (lVar7 <= lVar5) {
          dVar12 = local_d0;
        }
        dVar12 = local_d8 + (dVar11 - dVar12);
        dVar10 = (double)((long)dVar10 + 1);
        in_ST5 = in_ST4;
        dVar11 = local_118;
      } while ((ulong)dVar10 < (ulong)this->_K);
      local_118 = local_118 / dVar12;
    }
    local_e0 = local_118 / (double)this->_V;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->_beta,(ulong)this->_V,&local_e0);
  }
  else {
    if (this->_K == 0) {
      local_f8 = 0.0;
    }
    else {
      local_f8 = 0.0;
      uVar2 = 0;
      lVar5 = (longdouble)1.79769313486232e+308;
      do {
        local_38 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar2] + this->_betaSum;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_e0,(longdouble)local_38,in_RDX,in_RCX);
        dVar10 = 0.0;
        piVar1 = extraout_RDX;
        lVar6 = in_ST1;
        lVar7 = in_ST3;
        if (lVar5 < ABS(in_ST0)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          dVar10 = (double)in_ST0;
          piVar1 = extraout_RDX_00;
          lVar6 = in_ST1;
          lVar7 = in_ST3;
          local_40 = dVar10;
        }
        in_ST3 = in_ST5;
        in_ST1 = lVar7;
        local_48 = (double)in_ST0;
        if (ABS(in_ST0) <= lVar5) {
          dVar10 = local_48;
        }
        lVar8 = in_ST3;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_e0,(longdouble)this->_betaSum,piVar1,in_RCX);
        dVar11 = 0.0;
        in_RDX = extraout_RDX_01;
        in_ST0 = in_ST2;
        lVar7 = in_ST4;
        if (lVar5 < ABS(lVar6)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          dVar11 = (double)lVar6;
          in_RDX = extraout_RDX_02;
          in_ST0 = in_ST2;
          lVar7 = in_ST4;
          local_50 = dVar11;
        }
        in_ST4 = lVar8;
        in_ST2 = lVar7;
        local_58 = (double)lVar6;
        if (ABS(lVar6) <= lVar5) {
          dVar11 = local_58;
        }
        local_f8 = local_f8 + (dVar10 - dVar11);
        uVar2 = uVar2 + 1;
        in_ST5 = in_ST4;
      } while (uVar2 < this->_K);
    }
    if (this->_V != 0) {
      uVar2 = 0;
      lVar5 = (longdouble)1.79769313486232e+308;
      do {
        dVar10 = 0.0;
        if (this->_K != 0) {
          lVar3 = 0;
          uVar4 = 0;
          lVar6 = in_ST1;
          lVar7 = in_ST3;
          do {
            in_ST3 = in_ST5;
            in_ST1 = lVar7;
            pol = *(policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                    **)((long)&(((this->_nkv).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data + lVar3);
            local_60 = *(double *)(pol + uVar2 * 8) +
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar2];
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,&local_f9,(longdouble)local_60,in_RDX,pol);
            dVar11 = 0.0;
            piVar1 = extraout_RDX_11;
            lVar7 = in_ST3;
            if (lVar5 < ABS(in_ST0)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              dVar11 = (double)in_ST0;
              piVar1 = extraout_RDX_12;
              local_68 = dVar11;
            }
            local_70 = (double)in_ST0;
            if (ABS(in_ST0) <= lVar5) {
              dVar11 = local_70;
            }
            in_ST0 = in_ST2;
            in_ST2 = in_ST4;
            in_ST4 = lVar7;
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_e0,
                       (longdouble)
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar2],piVar1,pol);
            local_ec = ABS(lVar6);
            dVar12 = 0.0;
            in_RDX = extraout_RDX_13;
            in_ST5 = in_ST4;
            if (lVar5 < local_ec) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              dVar12 = (double)lVar6;
              in_RDX = extraout_RDX_14;
              local_78 = dVar12;
            }
            local_80 = (double)lVar6;
            if (local_ec <= lVar5) {
              dVar12 = local_80;
            }
            dVar10 = dVar10 + (dVar11 - dVar12) *
                              (this->_beta).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar2];
            uVar4 = uVar4 + 1;
            lVar3 = lVar3 + 0x18;
            lVar6 = in_ST1;
            lVar7 = in_ST3;
          } while (uVar4 < this->_K);
        }
        (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] = dVar10 / local_f8;
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->_V);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_betaTimeSeries,&this->_beta);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateBeta(BetaUpdateManner manner){//{{{
    if(manner == SYMMETRY){
        double numerator=0;
        double denominator=0;
        for(int k=0;k<_K;k++){
            for(int v=0;v<_V;v++){
                numerator += (boost::math::digamma(_nkv[k][v]+_beta[v]) - boost::math::digamma(_beta[v]))*_beta[v];
            }
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        double commonBeta = numerator/denominator/_V;
        _beta.assign(_V, commonBeta);
    }else{
        double denominator=0;
        for(int k=0;k<_K;k++){
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        for(int v=0;v<_V;v++){
            double numerator=0;
            for(int k=0;k<_K;k++){
                try{
                    numerator += (boost::math::digamma(_nkv[k][v]+_beta[v])-boost::math::digamma(_beta[v]))*_beta[v];
                }catch(...){
                    numerator += 0;
                }
            }
            _beta[v] = numerator/denominator;
        }
    }
    _betaTimeSeries.push_back(_beta);
}